

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

void generate_room(chunk_conflict *c,wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2,wchar_t light)

{
  loc_conflict grid_00;
  loc_conflict grid_01;
  square_conflict *psVar1;
  wchar_t local_2c;
  wchar_t wStack_28;
  loc grid;
  wchar_t light_local;
  wchar_t x2_local;
  wchar_t y2_local;
  wchar_t x1_local;
  wchar_t y1_local;
  chunk_conflict *c_local;
  
  for (wStack_28 = y1; local_2c = x1, wStack_28 <= y2; wStack_28 = wStack_28 + L'\x01') {
    for (; local_2c <= x2; local_2c = local_2c + L'\x01') {
      grid_00.y = wStack_28;
      grid_00.x = local_2c;
      psVar1 = square((chunk *)c,grid_00);
      flag_on_dbg(psVar1->info,3,4,"square(c, grid)->info","SQUARE_ROOM");
      if (light != L'\0') {
        grid_01.y = wStack_28;
        grid_01.x = local_2c;
        psVar1 = square((chunk *)c,grid_01);
        flag_on_dbg(psVar1->info,3,2,"square(c, grid)->info","SQUARE_GLOW");
      }
    }
  }
  return;
}

Assistant:

static void generate_room(struct chunk *c, int y1, int x1, int y2, int x2,
						  int light)
{
	struct loc grid;
	for (grid.y = y1; grid.y <= y2; grid.y++)
		for (grid.x = x1; grid.x <= x2; grid.x++) {
			sqinfo_on(square(c, grid)->info, SQUARE_ROOM);
			if (light)
				sqinfo_on(square(c, grid)->info, SQUARE_GLOW);
		}
}